

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiAreaPrivate::showRubberBandFor(QMdiAreaPrivate *this,QMdiSubWindow *subWindow)

{
  QRubberBand *this_00;
  long lVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  int index;
  QRect *geom;
  long lVar4;
  QMdiSubWindow *pQVar5;
  long in_FS_OFFSET;
  QRect local_28;
  long local_18;
  
  geom = &local_28;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((subWindow != (QMdiSubWindow *)0x0) &&
     (this_00 = this->rubberBand, this_00 != (QRubberBand *)0x0)) {
    if (this->viewMode == TabbedView) {
      lVar1 = (this->childWindows).d.size;
      if (lVar1 == 0) {
LAB_00441924:
        index = -1;
      }
      else {
        pQVar2 = (this->childWindows).d.ptr;
        lVar4 = 0;
        index = -1;
        do {
          if (lVar1 << 4 == lVar4) goto LAB_00441924;
          lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar4);
          if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
            pQVar5 = (QMdiSubWindow *)0x0;
          }
          else {
            pQVar5 = *(QMdiSubWindow **)((long)&(pQVar2->wp).value + lVar4);
          }
          lVar4 = lVar4 + 0x10;
          index = index + 1;
        } while (pQVar5 != subWindow);
      }
      local_28 = QTabBar::tabRect(&this->tabBar->super_QTabBar,index);
    }
    else {
      geom = &((subWindow->super_QWidget).data)->crect;
    }
    QRubberBand::setGeometry(this_00,geom);
    QWidget::raise(&this->rubberBand->super_QWidget,(int)geom);
    QWidget::show(&this->rubberBand->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::showRubberBandFor(QMdiSubWindow *subWindow)
{
    if (!subWindow || !rubberBand)
        return;

#if QT_CONFIG(tabbar)
    if (viewMode == QMdiArea::TabbedView)
        rubberBand->setGeometry(tabBar->tabRect(childWindows.indexOf(subWindow)));
    else
#endif
        rubberBand->setGeometry(subWindow->geometry());

    rubberBand->raise();
    rubberBand->show();
}